

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_function_widget.cpp
# Opt level: O1

void __thiscall tfnw::TransferFunctionWidget::TransferFunctionWidget(TransferFunctionWidget *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  initializer_list<tfnw::TransferFunctionWidget::vec2f> __l;
  string local_48;
  allocator_type local_21;
  
  (this->current_colormap).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->current_colormap).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->colormaps).super__Vector_base<tfnw::Colormap,_std::allocator<tfnw::Colormap>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->selected_colormap = 0;
  (this->colormaps).super__Vector_base<tfnw::Colormap,_std::allocator<tfnw::Colormap>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->colormaps).super__Vector_base<tfnw::Colormap,_std::allocator<tfnw::Colormap>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->current_colormap).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_dataplus._M_p = (pointer)0x0;
  local_48._M_string_length = 0x3f8000003f800000;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_48;
  std::
  vector<tfnw::TransferFunctionWidget::vec2f,_std::allocator<tfnw::TransferFunctionWidget::vec2f>_>
  ::vector(&this->alpha_control_pts,__l,&local_21);
  this->selected_point = 0xffffffffffffffff;
  this->clicked_on_item = false;
  this->gpu_image_stale = true;
  this->colormap_changed = true;
  this->colormap_img = 0xffffffff;
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"ParaView Cool Warm","");
  load_embedded_preset(this,paraview_cool_warm,0x1b3,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Rainbow","");
  load_embedded_preset(this,rainbow,0x7f,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Matplotlib Plasma","");
  load_embedded_preset(this,matplotlib_plasma,0x17f,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Matplotlib Virdis","");
  load_embedded_preset(this,matplotlib_virdis,0x17b,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Samsel Linear Green","");
  load_embedded_preset(this,samsel_linear_green,0x18b,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Samsel Linear YGB 1211G","");
  load_embedded_preset(this,samsel_linear_ygb_1211g,0x1ac,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Cool Warm Extended","");
  load_embedded_preset(this,cool_warm_extended,0x1ea,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Black Body","");
  load_embedded_preset(this,blackbody,0x8b,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Jet","");
  load_embedded_preset(this,jet,0xce,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Blue Gold","");
  load_embedded_preset(this,blue_gold,0x168,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Ice Fire","");
  load_embedded_preset(this,ice_fire,0x203,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"nic Edge","");
  load_embedded_preset(this,nic_edge,0x230,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  update_colormap(this);
  return;
}

Assistant:

TransferFunctionWidget::TransferFunctionWidget()
{
    // Load up the embedded colormaps as the default options
    load_embedded_preset(paraview_cool_warm, sizeof(paraview_cool_warm), "ParaView Cool Warm");
    load_embedded_preset(rainbow, sizeof(rainbow), "Rainbow");
    load_embedded_preset(matplotlib_plasma, sizeof(matplotlib_plasma), "Matplotlib Plasma");
    load_embedded_preset(matplotlib_virdis, sizeof(matplotlib_virdis), "Matplotlib Virdis");
    load_embedded_preset(
        samsel_linear_green, sizeof(samsel_linear_green), "Samsel Linear Green");
    load_embedded_preset(
        samsel_linear_ygb_1211g, sizeof(samsel_linear_ygb_1211g), "Samsel Linear YGB 1211G");
    load_embedded_preset(cool_warm_extended, sizeof(cool_warm_extended), "Cool Warm Extended");
    load_embedded_preset(blackbody, sizeof(blackbody), "Black Body");
    load_embedded_preset(jet, sizeof(jet), "Jet");
    load_embedded_preset(blue_gold, sizeof(blue_gold), "Blue Gold");
    load_embedded_preset(ice_fire, sizeof(ice_fire), "Ice Fire");
    load_embedded_preset(nic_edge, sizeof(nic_edge), "nic Edge");

    // Initialize the colormap alpha channel w/ a linear ramp
    update_colormap();
}